

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

void av1_init_inter_params
               (InterPredParams *inter_pred_params,int block_width,int block_height,int pix_row,
               int pix_col,int subsampling_x,int subsampling_y,int bit_depth,int use_hbd_buf,
               int is_intrabc,scale_factors *sf,buf_2d *ref_buf,int_interpfilters interp_filters)

{
  undefined8 uVar1;
  undefined8 *puVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  InterPredParams *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  undefined4 in_stack_00000028;
  int in_stack_ffffffffffffffac;
  int in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc4;
  
  init_inter_block_params
            (in_RDI,in_ESI,in_EDX,in_ECX,in_R8D,in_R9D,in_stack_00000008,in_stack_00000010,
             in_stack_00000018,in_stack_00000020);
  init_interp_filter_params
            ((InterpFilterParams **)CONCAT44(in_stack_ffffffffffffffc4,in_stack_00000020),
             (InterpFilters *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_00000018),
             in_stack_ffffffffffffffb4,in_stack_00000010,in_stack_ffffffffffffffac);
  in_RDI->scale_factors = (scale_factors *)CONCAT44(subsampling_x,in_stack_00000028);
  puVar2 = (undefined8 *)CONCAT44(pix_row,pix_col);
  (in_RDI->ref_frame_buf).buf = (uint8_t *)*puVar2;
  (in_RDI->ref_frame_buf).buf0 = (uint8_t *)puVar2[1];
  uVar1 = puVar2[2];
  (in_RDI->ref_frame_buf).width = (int)uVar1;
  (in_RDI->ref_frame_buf).height = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(in_RDI->ref_frame_buf).stride = puVar2[3];
  return;
}

Assistant:

static inline void av1_init_inter_params(
    InterPredParams *inter_pred_params, int block_width, int block_height,
    int pix_row, int pix_col, int subsampling_x, int subsampling_y,
    int bit_depth, int use_hbd_buf, int is_intrabc,
    const struct scale_factors *sf, const struct buf_2d *ref_buf,
    int_interpfilters interp_filters) {
  init_inter_block_params(inter_pred_params, block_width, block_height, pix_row,
                          pix_col, subsampling_x, subsampling_y, bit_depth,
                          use_hbd_buf, is_intrabc);
  init_interp_filter_params(inter_pred_params->interp_filter_params,
                            &interp_filters.as_filters, block_width,
                            block_height, is_intrabc);
  inter_pred_params->scale_factors = sf;
  inter_pred_params->ref_frame_buf = *ref_buf;
}